

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

FxExpression * __thiscall FxPlusSign::Resolve(FxPlusSign *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FxExpression *e;
  FCompileContext *ctx_local;
  FxPlusSign *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if (this->Operand != (FxExpression *)0x0) {
      iVar2 = (*this->Operand->_vptr_FxExpression[2])(this->Operand,ctx);
      this->Operand = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if (this->Operand == (FxExpression *)0x0) {
      if (this != (FxPlusSign *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxPlusSign *)0x0;
    }
    else {
      bVar1 = FxExpression::IsNumeric(this->Operand);
      if (bVar1) {
        this_local = (FxPlusSign *)this->Operand;
        this->Operand = (FxExpression *)0x0;
        if (this != (FxPlusSign *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
      }
      else {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
        if (this != (FxPlusSign *)0x0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])();
        }
        this_local = (FxPlusSign *)0x0;
      }
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxPlusSign::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->IsNumeric())
	{
		FxExpression *e = Operand;
		Operand = NULL;
		delete this;
		return e;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
}